

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O1

put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::Data>
* __thiscall
density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
start_emplace<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::Data>
          (put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::Data>
           *__return_storage_ptr__,
          conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *this)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_78;
  put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::Data>
  local_68;
  put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::Data>
  local_50;
  
  local_78._M_owns = false;
  local_78._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_78);
  local_78._M_owns = true;
  heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  start_emplace<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>>::Data>
            (&local_68,
             (heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             (this + 0x28));
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::Data>
  ::put_transaction(&local_50,0,&local_78,&local_68);
  (__return_storage_ptr__->m_lock)._M_device = local_50.m_lock._M_device;
  (__return_storage_ptr__->m_lock)._M_owns = local_50.m_lock._M_owns;
  local_50.m_lock._M_device = (mutex_type *)0x0;
  local_50.m_lock._M_owns = false;
  (__return_storage_ptr__->m_put_transaction).m_queue = local_50.m_put_transaction.m_queue;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_control_block =
       local_50.m_put_transaction.m_put_data.m_control_block;
  (__return_storage_ptr__->m_put_transaction).m_put_data.m_user_storage =
       local_50.m_put_transaction.m_put_data.m_user_storage;
  local_50.m_put_transaction.m_queue =
       (heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_> *)
       0x0;
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::Data>
  ::~put_transaction(&local_50);
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  put_transaction<density_tests::detail::PutRawBlocks<density::conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>_>::Data>
  ::~put_transaction(&local_68);
  std::unique_lock<std::mutex>::~unique_lock(&local_78);
  return __return_storage_ptr__;
}

Assistant:

put_transaction<ELEMENT_TYPE> start_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            std::unique_lock<std::mutex> lock(m_mutex);
            return put_transaction<ELEMENT_TYPE>(
              PrivateType(),
              std::move(lock),
              m_queue.template start_emplace<ELEMENT_TYPE>(
                std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...));
        }